

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_average_down_boundaries(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  FabType FVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  EBFArrayBoxFactory *this;
  IntVect *pIVar10;
  Periodicity *period;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int jj;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined8 *puVar26;
  double dVar27;
  Box result;
  MFIter mfi;
  Box local_3ac;
  long local_390;
  long local_388;
  long local_380;
  int local_374;
  int local_370;
  int local_36c;
  FabArray<amrex::FArrayBox> *local_368;
  ulong local_360;
  long local_358;
  FabArray<amrex::FArrayBox> *local_350;
  BoxArray local_348;
  MultiCutFab *local_2d8;
  FabArray<amrex::EBCellFlagFab> *local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_268;
  ulong local_260;
  long local_258;
  long local_250;
  undefined1 local_248 [24];
  pointer local_230;
  undefined8 uStack_228;
  int local_220;
  Array4<const_double> local_208;
  MFItInfo local_1c4;
  undefined1 local_1b0 [384];
  
  uVar2 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  bVar5 = FabArray<amrex::FArrayBox>::hasEBFabFactory(&fine->super_FabArray<amrex::FArrayBox>);
  if (!bVar5) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&crse->super_FabArray<amrex::FArrayBox>,0.0,0,uVar2,ngcrse);
    return;
  }
  local_380 = (long)ratio->vect[0];
  local_388 = (long)ratio->vect[1];
  local_390 = (long)ratio->vect[2];
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((fine->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_2d0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
  local_2d8 = EBFArrayBoxFactory::getBndryArea(this);
  bVar5 = isMFIterSafe((FabArrayBase *)fine,(FabArrayBase *)crse);
  if (bVar5) {
    local_1c4.num_streams = Gpu::Device::max_gpu_streams;
    local_1c4.do_tiling = true;
    local_1c4.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_1c4.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_1c4.tilesize.vect[2] = DAT_007d7ef0;
    local_1c4.dynamic = true;
    local_1c4.device_sync = true;
    MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)crse,&local_1c4);
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar23 = (ulong)uVar2;
    local_368 = &crse->super_FabArray<amrex::FArrayBox>;
    local_360 = uVar23;
    local_350 = &fine->super_FabArray<amrex::FArrayBox>;
    while ((int)local_1b0._32_4_ < (int)local_1b0._40_4_) {
      MFIter::growntilebox(&local_3ac,(MFIter *)local_1b0,ngcrse);
      pIVar10 = &(((FabArray<amrex::FArrayBox> *)local_1b0)->super_FabArrayBase).boxarray.m_bat.m_op
                 .m_bndryReg.m_loshft;
      if ((long *)local_1b0._64_8_ != (long *)0x0) {
        pIVar10 = (IntVect *)((long)(int)local_1b0._32_4_ * 4 + *(long *)local_1b0._64_8_);
      }
      local_348.m_bat._0_8_ = CONCAT44(local_3ac.smallend.vect[1],local_3ac.smallend.vect[0]);
      local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] = local_3ac.bigend.vect[1];
      local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = local_3ac.bigend.vect[2];
      local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = local_3ac.btype.itype;
      local_348.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)local_3ac.smallend.vect[2]
      ;
      local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = local_3ac.bigend.vect[0];
      iVar7 = ratio->vect[0];
      iVar9 = ratio->vect[1];
      iVar3 = ratio->vect[2];
      if (iVar3 != 1 || (iVar9 != 1 || iVar7 != 1)) {
        uVar2 = (uint)((local_3ac.btype.itype & 2) == 0);
        local_348.m_bat.m_op.m_indexType.m_typ.itype =
             (BATindexType)(local_3ac.smallend.vect[1] * iVar9);
        local_348.m_bat.m_bat_type = local_3ac.smallend.vect[0] * iVar7;
        local_348.m_bat.m_op.m_bndryReg.m_typ.itype =
             (IndexType)(local_3ac.smallend.vect[2] * iVar3);
        uVar15 = (uint)((local_3ac.btype.itype & 4) == 0);
        local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
             (local_3ac.bigend.vect[0] + (~local_3ac.btype.itype & 1)) * iVar7 -
             (~local_3ac.btype.itype & 1);
        local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
             (local_3ac.bigend.vect[1] + uVar2) * iVar9 - uVar2;
        local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] =
             (local_3ac.bigend.vect[2] + uVar15) * iVar3 - uVar15;
      }
      FVar6 = EBCellFlagFab::getType
                        ((local_2d0->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[pIVar10->vect[0]],
                         (Box *)&local_348);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_348,&crse->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)local_1b0);
      if ((uint)(FVar6 + singlevalued) < 2) {
        lVar17 = 0;
        for (uVar19 = 0; lVar11 = (long)local_3ac.smallend.vect[2], uVar19 != uVar23;
            uVar19 = uVar19 + 1) {
          for (; lVar24 = (long)local_3ac.smallend.vect[1], (int)lVar11 <= local_3ac.bigend.vect[2];
              lVar11 = lVar11 + 1) {
            for (; (int)lVar24 <= local_3ac.bigend.vect[1]; lVar24 = lVar24 + 1) {
              puVar26 = (undefined8 *)
                        (local_348.m_bat._0_8_ +
                        CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[1],
                                 local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) * lVar17 +
                        (lVar11 - local_348.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                        CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2],
                                 local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1]) * 8 +
                        (lVar24 - local_348.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                        CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                 local_348.m_bat.m_op.m_bndryReg.m_typ.itype) * 8 +
                        (long)local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * -8 +
                        (long)local_3ac.smallend.vect[0] * 8);
              for (lVar20 = (long)local_3ac.smallend.vect[0]; lVar20 <= local_3ac.bigend.vect[0];
                  lVar20 = lVar20 + 1) {
                *puVar26 = 0;
                puVar26 = puVar26 + 1;
              }
              fine = (MultiFab *)local_350;
              crse = (MultiFab *)local_368;
            }
          }
          lVar17 = lVar17 + 8;
          uVar23 = local_360;
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_248,&fine->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1b0);
        MultiCutFab::const_array(&local_208,local_2d8,(MFIter *)local_1b0);
        local_2b0 = (long)local_3ac.smallend.vect[0];
        local_2c8 = (long)local_3ac.smallend.vect[1];
        local_288 = (long)local_3ac.bigend.vect[0];
        local_2a8 = (long)local_3ac.bigend.vect[1];
        local_2c0 = (long)local_3ac.bigend.vect[2];
        local_370 = local_3ac.smallend.vect[0] * (int)local_380;
        local_374 = local_3ac.smallend.vect[1] * (int)local_388;
        iVar7 = local_3ac.smallend.vect[2] * (int)local_390;
        lVar17 = (long)local_3ac.smallend.vect[2];
        while (lVar11 = lVar17, lVar11 <= local_2c0) {
          local_358 = (long)iVar7;
          local_2b8 = lVar11 + 1;
          local_250 = local_2b8 * local_390;
          lVar17 = local_2c8;
          iVar9 = local_374;
          while (lVar24 = lVar17, lVar24 <= local_2a8) {
            lVar20 = (long)iVar9;
            local_2a0 = lVar24 + 1;
            lVar17 = local_2b0;
            iVar3 = local_370;
            while (iVar8 = iVar3, lVar17 <= local_288) {
              local_268 = (long)iVar8 * 8;
              local_280 = lVar17 + 1;
              local_278 = local_348.m_bat._0_8_ +
                          ((lVar24 - local_348.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                           CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                    local_348.m_bat.m_op.m_bndryReg.m_typ.itype) +
                          (lVar17 - local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) +
                          (lVar11 - local_348.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                          CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2],
                                   local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1])) * 8;
              lVar17 = 0;
              uVar19 = 0;
              while (uVar14 = uVar19, lVar12 = lVar17, uVar14 != uVar23) {
                lVar16 = local_248._0_8_ +
                         (long)local_230 * lVar12 +
                         (lVar20 - uStack_228._4_4_) * local_248._8_8_ * 8 +
                         (local_358 - local_220) * local_248._16_8_ * 8 + (long)(int)uStack_228 * -8
                         + local_268;
                lVar18 = (long)local_208.p +
                         (lVar20 - local_208.begin.y) * local_208.jstride * 8 +
                         (local_358 - local_208.begin.z) * local_208.kstride * 8 +
                         (long)local_208.begin.x * -8 + local_268;
                dVar4 = 0.0;
                dVar27 = 0.0;
                for (lVar17 = local_358; lVar21 = lVar18, lVar22 = lVar20, lVar25 = lVar16,
                    lVar17 < local_250; lVar17 = lVar17 + 1) {
                  for (; lVar22 < local_2a0 * local_388; lVar22 = lVar22 + 1) {
                    for (lVar13 = 0; iVar8 + lVar13 < local_280 * local_380; lVar13 = lVar13 + 1) {
                      dVar1 = *(double *)(lVar21 + lVar13 * 8);
                      dVar4 = dVar4 + *(double *)(lVar25 + lVar13 * 8) * dVar1;
                      dVar27 = dVar27 + dVar1;
                    }
                    lVar21 = lVar21 + local_208.jstride * 8;
                    lVar25 = lVar25 + local_248._8_8_ * 8;
                  }
                  lVar16 = lVar16 + local_248._16_8_ * 8;
                  lVar18 = lVar18 + local_208.kstride * 8;
                  fine = (MultiFab *)local_350;
                }
                *(ulong *)(local_278 +
                          CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[1],
                                   local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[0]) * uVar14 * 8) =
                     -(ulong)(1e-30 < dVar27) & (ulong)(dVar4 / dVar27);
                lVar17 = lVar12 + 8;
                uVar23 = local_360;
                local_260 = uVar14;
                local_258 = lVar12;
                uVar19 = uVar14 + 1;
              }
              lVar17 = local_280;
              crse = (MultiFab *)local_368;
              iVar3 = iVar8 + (int)local_380;
              local_36c = iVar8;
            }
            iVar9 = (int)local_388 + iVar9;
            lVar17 = local_2a0;
            local_290 = lVar24;
          }
          iVar7 = (int)local_390 + iVar7;
          lVar17 = local_2b8;
          local_298 = lVar11;
        }
      }
      MFIter::operator++((MFIter *)local_1b0);
    }
    MFIter::~MFIter((MFIter *)local_1b0);
  }
  else {
    BoxArray::BoxArray(&local_348,
                       &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
    BoxArray::coarsen(&local_348,ratio);
    local_248._0_8_ = (double *)0x1;
    local_248._8_8_ = (Arena *)0x0;
    local_248._16_8_ = (pointer)0x0;
    local_230 = (pointer)0x0;
    uStack_228 = (pointer)0x0;
    local_208.p = (double *)&PTR__FabFactory_007d2928;
    MultiFab::MultiFab((MultiFab *)local_1b0,&local_348,
                       &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                       uVar2,ngcrse,(MFInfo *)local_248,(FabFactory<amrex::FArrayBox> *)&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_248 + 0x10));
    EB_average_down_boundaries(fine,(MultiFab *)local_1b0,ratio,ngcrse);
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)local_1b0,0,0,
               uVar2,ngcrse,ngcrse,period,COPY);
    MultiFab::~MultiFab((MultiFab *)local_1b0);
    BoxArray::~BoxArray(&local_348);
  }
  return;
}

Assistant:

void EB_average_down_boundaries (const MultiFab& fine, MultiFab& crse,
                                 const IntVect& ratio, int ngcrse)
{
    int ncomp = crse.nComp();

    if (!fine.hasEBFabFactory())
    {
        crse.setVal(0.0, 0, ncomp, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fine.Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& barea = factory.getBndryArea();

        if (isMFIterSafe(fine, crse))
        {
            MFItInfo info;
            if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse, info); mfi.isValid(); ++mfi)
            {
                const Box& tbx = mfi.growntilebox(ngcrse);
                FabType typ = flags[mfi].getType(amrex::refine(tbx,ratio));
                Array4<Real> const& ca = crse.array(mfi);
                if (FabType::covered == typ || FabType::regular == typ) {
                    AMREX_HOST_DEVICE_FOR_4D(tbx,ncomp,i,j,k,n,
                    {
                        ca(i,j,k,n) = 0.0;
                    });
                } else {
                    Array4<Real const> const& fa = fine.const_array(mfi);
                    Array4<Real const> const& ba = barea.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                    {
                        eb_avgdown_boundaries(i,j,k,fa,0,ca,0,ba,dratio,ncomp);
                    });
                }
            }
        }
        else
        {
            BoxArray cba = fine.boxArray();
            cba.coarsen(ratio);
            MultiFab ctmp(cba, fine.DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            EB_average_down_boundaries(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp, 0, 0, ncomp, ngcrse, ngcrse);
        }
    }
}